

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::CoreMLModels::WordTagger::MergePartialFromCodedStream
          (WordTagger *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  char *pcVar5;
  string *psVar6;
  StringVector *value;
  bool local_8a;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  WordTagger *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if (input->buffer_ < input->buffer_end_) {
      tag_2 = (uint32)*input->buffer_;
      if ((char)*input->buffer_ < '\x01') {
        if ((input->buffer_end_ <= input->buffer_ + 1) ||
           ((*input->buffer_ & (input->buffer_[1] ^ 0xff)) < 0x80)) goto LAB_0036d57a;
        uStack_30 = 0x3fff;
        tag_1 = (uint)input->buffer_[1] * 0x80 + (*input->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(input,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
    }
    else {
LAB_0036d57a:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) {
LAB_0036da13:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      if (iVar2 == 1) {
        if ((tag_00 & 0xff) != 8) goto LAB_0036da13;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (input,&this->revision_);
      }
      else if (iVar2 == 10) {
        if ((tag_00 & 0xff) != 0x52) goto LAB_0036da13;
        psVar6 = mutable_language_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar6);
        if (!bVar1) {
          return false;
        }
        language_abi_cxx11_(this);
        pcVar5 = (char *)std::__cxx11::string::data();
        language_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar5,iVar2,PARSE,
                           "CoreML.Specification.CoreMLModels.WordTagger.language");
      }
      else if (iVar2 == 0x14) {
        if ((tag_00 & 0xff) != 0xa2) goto LAB_0036da13;
        psVar6 = mutable_tokensoutputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar6);
        if (!bVar1) {
          return false;
        }
        tokensoutputfeaturename_abi_cxx11_(this);
        pcVar5 = (char *)std::__cxx11::string::data();
        tokensoutputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar5,iVar2,PARSE,
                           "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName");
      }
      else if (iVar2 == 0x15) {
        if ((tag_00 & 0xff) != 0xaa) goto LAB_0036da13;
        psVar6 = mutable_tokentagsoutputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar6);
        if (!bVar1) {
          return false;
        }
        tokentagsoutputfeaturename_abi_cxx11_(this);
        pcVar5 = (char *)std::__cxx11::string::data();
        tokentagsoutputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar5,iVar2,PARSE,
                           "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName"
                          );
      }
      else if (iVar2 == 0x16) {
        if ((tag_00 & 0xff) != 0xb2) goto LAB_0036da13;
        psVar6 = mutable_tokenlocationsoutputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar6);
        if (!bVar1) {
          return false;
        }
        tokenlocationsoutputfeaturename_abi_cxx11_(this);
        pcVar5 = (char *)std::__cxx11::string::data();
        tokenlocationsoutputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar5,iVar2,PARSE,
                           "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName"
                          );
      }
      else if (iVar2 == 0x17) {
        if ((tag_00 & 0xff) != 0xba) goto LAB_0036da13;
        psVar6 = mutable_tokenlengthsoutputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar6);
        if (!bVar1) {
          return false;
        }
        tokenlengthsoutputfeaturename_abi_cxx11_(this);
        pcVar5 = (char *)std::__cxx11::string::data();
        tokenlengthsoutputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar5,iVar2,PARSE,
                           "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName"
                          );
      }
      else if (iVar2 == 100) {
        if ((tag_00 & 0xff) != 0x22) goto LAB_0036da13;
        psVar6 = mutable_modelparameterdata_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      }
      else {
        if ((iVar2 != 200) || ((tag_00 & 0xff) != 0x42)) goto LAB_0036da13;
        value = mutable_stringtags(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::StringVector>(input,value);
      }
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool WordTagger::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.WordTagger)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 revision = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &revision_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string language = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_language()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->language().data(), this->language().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.language"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokensOutputFeatureName = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokensoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokensoutputfeaturename().data(), this->tokensoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenTagsOutputFeatureName = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokentagsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokentagsoutputfeaturename().data(), this->tokentagsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenLocationsOutputFeatureName = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(178u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokenlocationsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokenlocationsoutputfeaturename().data(), this->tokenlocationsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenLengthsOutputFeatureName = 23;
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(186u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokenlengthsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokenlengthsoutputfeaturename().data(), this->tokenlengthsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes modelParameterData = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_modelparameterdata()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringTags = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringtags()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.WordTagger)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.WordTagger)
  return false;
#undef DO_
}